

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load-balance-collective.hpp
# Opt level: O2

void diy::detail::move_block(Master *master,MoveInfo *move_info)

{
  communicator *this;
  int iVar1;
  void *pvVar2;
  Link *l;
  function<void_(const_void_*,_diy::BinaryBuffer_&)> fStack_98;
  MemoryBuffer local_78;
  
  if (move_info->src_proc == move_info->dst_proc) {
    fmt::v7::print<char[79],,char>
              (_stderr,(char (*) [79])
                       "Error: move_block(): source and destination are same. This should not happen.\n"
              );
    abort();
  }
  this = &master->comm_;
  iVar1 = (master->comm_).rank_;
  if (iVar1 == move_info->src_proc) {
    local_78.super_BinaryBuffer._vptr_BinaryBuffer = (_func_int **)&PTR__MemoryBuffer_001ba748;
    local_78.position = 0;
    local_78.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_78.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_78.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_78.blob_position = 0;
    local_78.blobs.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.blobs.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.blobs.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar1 = Master::lid(master,move_info->move_gid);
    pvVar2 = (master->blocks_).elements_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
             .super__Vector_impl_data._M_start[iVar1];
    Catch::clara::std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::function
              (&fStack_98,&(master->blocks_).save_);
    Catch::clara::std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::operator()
              (&fStack_98,pvVar2,&local_78.super_BinaryBuffer);
    Catch::clara::std::_Function_base::~_Function_base(&fStack_98.super__Function_base);
    mpi::communicator::send<std::vector<char,std::allocator<char>>>
              (this,move_info->dst_proc,0,&local_78.buffer);
    iVar1 = Master::lid(master,move_info->move_gid);
    LinkFactory::save(&local_78.super_BinaryBuffer,
                      (master->links_).super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar1]);
    mpi::communicator::send<std::vector<char,std::allocator<char>>>
              (this,move_info->dst_proc,0,&local_78.buffer);
    iVar1 = Master::lid(master,move_info->move_gid);
    Catch::clara::std::function<void_(void_*)>::function
              ((function<void_(void_*)> *)&fStack_98,&(master->blocks_).destroy_);
    pvVar2 = Master::release(master,iVar1);
    Catch::clara::std::function<void_(void_*)>::operator()
              ((function<void_(void_*)> *)&fStack_98,pvVar2);
    Catch::clara::std::_Function_base::~_Function_base(&fStack_98.super__Function_base);
  }
  else {
    if (iVar1 != move_info->dst_proc) {
      return;
    }
    local_78.super_BinaryBuffer._vptr_BinaryBuffer = (_func_int **)&PTR__MemoryBuffer_001ba748;
    local_78.position = 0;
    local_78.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_78.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_78.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_78.blob_position = 0;
    local_78.blobs.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.blobs.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.blobs.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Catch::clara::std::function<void_*()>::function
              ((function<void_*()> *)&fStack_98,&(master->blocks_).create_);
    pvVar2 = Catch::clara::std::function<void_*()>::operator()((function<void_*()> *)&fStack_98);
    Catch::clara::std::_Function_base::~_Function_base(&fStack_98.super__Function_base);
    mpi::communicator::recv<std::vector<char,std::allocator<char>>>
              ((status *)&fStack_98,this,move_info->src_proc,0,&local_78.buffer);
    Catch::clara::std::function<void_(void_*,_diy::BinaryBuffer_&)>::function
              ((function<void_(void_*,_diy::BinaryBuffer_&)> *)&fStack_98,&(master->blocks_).load_);
    Catch::clara::std::function<void_(void_*,_diy::BinaryBuffer_&)>::operator()
              ((function<void_(void_*,_diy::BinaryBuffer_&)> *)&fStack_98,pvVar2,
               &local_78.super_BinaryBuffer);
    Catch::clara::std::_Function_base::~_Function_base(&fStack_98.super__Function_base);
    mpi::communicator::recv<std::vector<char,std::allocator<char>>>
              ((status *)&fStack_98,this,move_info->src_proc,0,&local_78.buffer);
    l = LinkFactory::load(&local_78.super_BinaryBuffer);
    Master::add(master,move_info->move_gid,pvVar2,l);
  }
  MemoryBuffer::~MemoryBuffer(&local_78);
  return;
}

Assistant:

inline void move_block(diy::Master&            master,
                const MoveInfo&         move_info)
{
    // sanity check that source and destination are different
    if (move_info.src_proc == move_info.dst_proc)
    {
        fmt::print(stderr, "Error: move_block(): source and destination are same. This should not happen.\n");
        abort();
    }

    if (master.communicator().rank() == move_info.src_proc)
    {
        diy::MemoryBuffer bb;

        // move the block from src to dst proc
        void* send_b = master.block(master.lid(move_info.move_gid));
        master.saver()(send_b, bb);
        master.communicator().send(move_info.dst_proc, 0, bb.buffer);

        // move the link for the moving block
        diy::Link* send_link = master.link(master.lid(move_info.move_gid));
        diy::LinkFactory::save(bb, send_link);
        master.communicator().send(move_info.dst_proc, 0, bb.buffer);

        // remove the block from the master
        int move_lid = master.lid(move_info.move_gid);
        master.destroyer()(master.release(move_lid));
    }
    else if (master.communicator().rank() == move_info.dst_proc)
    {
        diy::MemoryBuffer bb;

        // move the block from src to dst proc
        void* recv_b = master.creator()();
        master.communicator().recv(move_info.src_proc, 0, bb.buffer);
        master.loader()(recv_b, bb);

        // move the link for the moving block
        diy::Link* recv_link;
        master.communicator().recv(move_info.src_proc, 0, bb.buffer);
        recv_link = diy::LinkFactory::load(bb);

        // add the block to the master
        master.add(move_info.move_gid, recv_b, recv_link);
    }
}